

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  cmTarget *pcVar1;
  pointer pcVar2;
  bool bVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  ostringstream e;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"EXPORT_NAME","");
  __s = GetProperty(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    pcVar1 = this->Target;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pcVar1->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pcVar1->Name)._M_string_length);
  }
  else {
    local_1a8._0_8_ = pcVar2;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar4);
    bVar3 = cmGeneratorExpression::IsValidTargetName((string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s,__s + sVar4);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EXPORT_NAME property \"",0x16);
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\" for \"",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\": is not valid.",0x10);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((char *)local_1c8,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  const char* exportName = this->GetProperty("EXPORT_NAME");

  if (exportName && *exportName) {
    if (!cmGeneratorExpression::IsValidTargetName(exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str().c_str());
      return "";
    }
    return exportName;
  }
  return this->GetName();
}